

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O3

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::start_new_instance
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          ComputationGraph *cg,vector<int,_std::allocator<int>_> *ctx)

{
  LSTMBuilder *pLVar1;
  pointer pEVar2;
  bool bVar3;
  ulong uVar4;
  pointer piVar5;
  uint uVar6;
  long lVar7;
  ComputationGraph *pCVar8;
  size_type __n;
  uint uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  initializer_list<dynet::expr::Expression> __l;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> ctx_embed;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> src_fwd;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> src_bwd;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> source_embeddings;
  undefined1 local_e8 [8];
  pointer pEStack_e0;
  pointer local_d8;
  undefined4 local_d0;
  ComputationGraph *local_c0;
  allocator_type local_b1;
  vector<int,_std::allocator<int>_> *local_b0;
  undefined1 local_a8 [8];
  pointer pEStack_a0;
  pointer local_98;
  undefined1 local_90 [24];
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_78;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_58;
  Expression local_40;
  undefined1 extraout_var [56];
  
  uVar4 = (ulong)((long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar9 = (uint)uVar4;
  this->slen = uVar9;
  local_78.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = cg;
  local_b0 = ctx;
  if (this->rnn_src_embeddings == false) {
    if (uVar9 != 0) {
      uVar4 = 0;
      do {
        dynet::expr::lookup(local_e8,cg,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                            (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar4]);
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
        emplace_back<dynet::expr::Expression>(&local_78,(Expression *)local_e8);
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->slen);
    }
  }
  else {
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)local_a8
               ,uVar4 & 0xffffffff,(allocator_type *)local_e8);
    pLVar1 = &this->builder_src_fwd;
    if ((*(uint *)&this->field_0x208 & 0xfffffffd) == 0) {
      *(undefined4 *)&this->field_0x208 = 1;
    }
    (**(code **)(*(long *)&pLVar1->field_0x0 + 0x58))(pLVar1,cg);
    local_d8 = (pointer)0x0;
    local_e8 = (undefined1  [8])0x0;
    pEStack_e0 = (pointer)0x0;
    RNNBuilder::start_new_sequence
              ((RNNBuilder *)pLVar1,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)local_e8
              );
    if (local_e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_e8);
    }
    if (this->slen == 0) {
      __n = 0;
    }
    else {
      lVar10 = 8;
      uVar4 = 0;
      do {
        dynet::expr::lookup(local_90,local_c0,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                            (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar4]);
        RNNBuilder::add_input((RNNBuilder *)local_e8,(Expression *)pLVar1);
        uVar4 = uVar4 + 1;
        *(undefined1 (*) [8])((long)local_a8 + lVar10 + -8) = local_e8;
        *(uint *)((long)(ComputationGraph **)local_a8 + lVar10) = pEStack_e0._0_4_;
        lVar10 = lVar10 + 0x10;
        __n = (size_type)this->slen;
        cg = local_c0;
      } while (uVar4 < __n);
    }
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)local_90
               ,__n,(allocator_type *)local_e8);
    pLVar1 = &this->builder_src_bwd;
    if ((*(uint *)&this->field_0x2d8 & 0xfffffffd) == 0) {
      *(undefined4 *)&this->field_0x2d8 = 1;
    }
    (**(code **)(*(long *)&pLVar1->field_0x0 + 0x58))(pLVar1,cg);
    local_d8 = (pointer)0x0;
    local_e8 = (undefined1  [8])0x0;
    pEStack_e0 = (pointer)0x0;
    RNNBuilder::start_new_sequence
              ((RNNBuilder *)pLVar1,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)local_e8
              );
    if (local_e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_e8);
    }
    uVar9 = this->slen;
    uVar6 = uVar9 - 1;
    if (-1 < (int)uVar6) {
      lVar11 = (ulong)uVar6 << 4;
      lVar10 = (ulong)uVar6 + 1;
      do {
        dynet::expr::lookup(&local_58,local_c0,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                            (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar10 + -1]);
        RNNBuilder::add_input((RNNBuilder *)local_e8,(Expression *)pLVar1);
        *(undefined1 (*) [8])((long)(ComputationGraph **)local_90._0_8_ + lVar11) = local_e8;
        *(uint *)((long)&((VariableIndex *)(local_90._0_8_ + 8))->t + lVar11) = pEStack_e0._0_4_;
        lVar11 = lVar11 + -0x10;
        lVar7 = lVar10 + -1;
        bVar3 = 0 < lVar10;
        lVar10 = lVar7;
      } while (lVar7 != 0 && bVar3);
      uVar9 = this->slen;
    }
    if (uVar9 != 0) {
      lVar10 = 8;
      uVar4 = 0;
      do {
        local_e8 = *(undefined1 (*) [8])((long)local_a8 + lVar10 + -8);
        pEStack_e0 = (pointer)CONCAT44(pEStack_e0._4_4_,
                                       *(uint *)((long)(ComputationGraph **)local_a8 + lVar10));
        local_d8 = *(pointer *)(local_90._0_8_ + lVar10 + -8);
        local_d0 = *(undefined4 *)((long)(ComputationGraph **)local_90._0_8_ + lVar10);
        __l._M_len = 2;
        __l._M_array = (iterator)local_e8;
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                  (&local_58,__l,&local_b1);
        expr::detail::
        f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                  ((detail *)&local_40,&local_58);
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
        emplace_back<dynet::expr::Expression>(&local_78,&local_40);
        if (local_58.
            super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar4 = uVar4 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar4 < this->slen);
    }
    if ((pointer)local_90._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_90._0_8_);
    }
    cg = local_c0;
    if (local_a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_a8);
    }
  }
  expr::detail::
  f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((detail *)local_e8,&local_78);
  (this->src).pg = (ComputationGraph *)local_e8;
  (this->src).i.t = pEStack_e0._0_4_;
  dynet::expr::parameter(local_e8,cg,*(undefined8 *)&this->p_R,*(undefined8 *)&this->field_0x28);
  (this->i_R).pg = (ComputationGraph *)local_e8;
  (this->i_R).i.t = pEStack_e0._0_4_;
  dynet::expr::parameter(local_e8,cg,*(undefined8 *)&this->p_Q,*(undefined8 *)&this->field_0x38);
  (this->i_Q).pg = (ComputationGraph *)local_e8;
  (this->i_Q).i.t = pEStack_e0._0_4_;
  dynet::expr::parameter(local_e8,cg,*(undefined8 *)&this->p_P,*(undefined8 *)&this->field_0x48);
  (this->i_P).pg = (ComputationGraph *)local_e8;
  (this->i_P).i.t = pEStack_e0._0_4_;
  dynet::expr::parameter(local_e8,cg,*(undefined8 *)&this->p_bias,*(undefined8 *)&this->field_0x68);
  (this->i_bias).pg = (ComputationGraph *)local_e8;
  (this->i_bias).i.t = pEStack_e0._0_4_;
  dynet::expr::parameter(local_e8,cg,*(undefined8 *)&this->p_Wa,*(undefined8 *)&this->field_0x78);
  (this->i_Wa).pg = (ComputationGraph *)local_e8;
  (this->i_Wa).i.t = pEStack_e0._0_4_;
  dynet::expr::parameter(local_e8,cg,*(undefined8 *)&this->p_Ua,*(undefined8 *)&this->field_0xa0);
  (this->i_Ua).pg = (ComputationGraph *)local_e8;
  (this->i_Ua).i.t = pEStack_e0._0_4_;
  dynet::expr::parameter(local_e8,cg,*(undefined8 *)&this->p_va,*(undefined8 *)&this->field_0xb0);
  (this->i_va).pg = (ComputationGraph *)local_e8;
  (this->i_va).i.t = pEStack_e0._0_4_;
  dynet::expr::operator*((Expression *)local_e8,&this->i_Ua);
  (this->i_uax).pg = (ComputationGraph *)local_e8;
  (this->i_uax).i.t = pEStack_e0._0_4_;
  this->num_aux_vecs = 0;
  if (((this->giza_fertility != false) || (this->giza_markov != false)) ||
     (this->giza_positional == true)) {
    auVar14._0_8_ =
         dynet::expr::parameter
                   (local_e8,cg,*(undefined8 *)&this->p_Ta,*(undefined8 *)&this->field_0xc0);
    auVar14._8_56_ = extraout_var;
    auVar13 = auVar14._0_16_;
    (this->i_Ta).pg = (ComputationGraph *)local_e8;
    (this->i_Ta).i.t = pEStack_e0._0_4_;
    if (this->giza_positional == true) {
      uVar9 = this->slen;
      auxiliary_vector(this);
      arange((ComputationGraph *)local_e8,(uint)local_c0,0,SUB41(uVar9,0),
             (vector<float,_std::allocator<float>_> *)0x1);
      (this->i_src_idx).pg = (ComputationGraph *)local_e8;
      (this->i_src_idx).i.t = pEStack_e0._0_4_;
      uVar9 = this->slen;
      auxiliary_vector(this);
      auVar13 = vcvtusi2sd_avx512f(auVar13,uVar9);
      dVar12 = log(auVar13._0_8_ + 1.0);
      repeat((ComputationGraph *)local_e8,(uint)local_c0,(float)dVar12,
             (vector<float,_std::allocator<float>_> *)(ulong)uVar9);
      (this->i_src_len).pg = (ComputationGraph *)local_e8;
      (this->i_src_len).i.t = pEStack_e0._0_4_;
    }
  }
  pEVar2 = (this->aligns).
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->aligns).
      super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    (this->aligns).
    super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar2;
  }
  uVar9 = this->slen;
  auxiliary_vector(this);
  repeat((ComputationGraph *)local_e8,(uint)local_c0,0.0,
         (vector<float,_std::allocator<float>_> *)(ulong)uVar9);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  emplace_back<dynet::expr::Expression>(&this->aligns,(Expression *)local_e8);
  pCVar8 = local_c0;
  pLVar1 = &this->builder;
  if ((*(uint *)&this->field_0x138 & 0xfffffffd) == 0) {
    *(undefined4 *)&this->field_0x138 = 1;
  }
  (**(code **)(*(long *)pLVar1 + 0x58))(pLVar1,local_c0);
  local_d8 = (pointer)0x0;
  local_e8 = (undefined1  [8])0x0;
  pEStack_e0 = (pointer)0x0;
  RNNBuilder::start_new_sequence
            ((RNNBuilder *)pLVar1,
             (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)local_e8);
  if (local_e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e8);
  }
  if ((local_b0 == (vector<int,_std::allocator<int>_> *)0x0) || (this->doc_context == false)) {
    this->has_document_context = false;
  }
  else {
    local_d8 = (pointer)0x0;
    local_e8 = (undefined1  [8])0x0;
    pEStack_e0 = (pointer)0x0;
    piVar5 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5;
    if (this->rnn_src_embeddings == false) {
      if (8 < uVar4) {
        uVar9 = 3;
        do {
          dynet::expr::lookup((Expression *)local_a8,pCVar8,*(undefined8 *)this,
                              *(undefined8 *)&this->field_0x8,piVar5[uVar9 - 2]);
          std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
          emplace_back<dynet::expr::Expression>
                    ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                     local_e8,(Expression *)local_a8);
          uVar4 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          piVar5 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2
                                ));
      }
    }
    else {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::resize
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_e8,((long)uVar4 >> 2) - 1);
      local_a8 = (undefined1  [8])0x0;
      pEStack_a0 = (pointer)0x0;
      local_98 = (pointer)0x0;
      RNNBuilder::start_new_sequence
                ((RNNBuilder *)&this->builder_src_fwd,
                 (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_a8);
      if (local_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_a8);
      }
      piVar5 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (4 < (ulong)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar5)) {
        uVar9 = 2;
        do {
          uVar6 = uVar9 - 2;
          dynet::expr::lookup(local_90,pCVar8,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                              piVar5[uVar6]);
          RNNBuilder::add_input((RNNBuilder *)local_a8,(Expression *)&this->builder_src_fwd);
          ((pointer)((long)local_e8 + (ulong)uVar6 * 0x10))->pg = (ComputationGraph *)local_a8;
          (((pointer)((long)local_e8 + (ulong)uVar6 * 0x10))->i).t = pEStack_a0._0_4_;
          uVar4 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          piVar5 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pCVar8 = local_c0;
        } while (uVar4 < (ulong)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2
                                ));
      }
    }
    expr::detail::
    f<dynet::Average,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)local_a8,&local_78);
    dynet::expr::parameter
              (local_90,pCVar8,*(undefined8 *)&this->p_S,*(undefined8 *)&this->field_0x58);
    (this->i_S).pg = (ComputationGraph *)local_90._0_8_;
    (this->i_S).i.t = local_90._8_4_;
    dynet::expr::operator*((Expression *)local_90,&this->i_S);
    (this->i_tt_ctx).pg = (ComputationGraph *)local_90._0_8_;
    (this->i_tt_ctx).i.t = local_90._8_4_;
    this->has_document_context = true;
    if (local_e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_e8);
    }
  }
  if (local_78.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AttentionalModel<Builder>::start_new_instance(const std::vector<int> &source, ComputationGraph &cg, const std::vector<int> *ctx)
{
    //slen = source.size() - 1; 
    slen = source.size(); 
    std::vector<Expression> source_embeddings;
    if (!rnn_src_embeddings) {
	for (unsigned s = 0; s < slen; ++s) 
	    source_embeddings.push_back(lookup(cg, p_cs, source[s]));
    } else {
	// run a RNN backward and forward over the source sentence
	// and stack the top-level hidden states from each model as 
	// the representation at each position
	std::vector<Expression> src_fwd(slen);
	builder_src_fwd.new_graph(cg);
	builder_src_fwd.start_new_sequence();
	for (unsigned i = 0; i < slen; ++i) 
	    src_fwd[i] = builder_src_fwd.add_input(lookup(cg, p_cs, source[i]));

	std::vector<Expression> src_bwd(slen);
	builder_src_bwd.new_graph(cg);
	builder_src_bwd.start_new_sequence();
	for (int i = slen-1; i >= 0; --i) {
	    // offset by one position to the right, to catch </s> and generally
	    // not duplicate the w_t already captured in src_fwd[t]
	    src_bwd[i] = builder_src_bwd.add_input(lookup(cg, p_cs, source[i]));
	}

	for (unsigned i = 0; i < slen; ++i) 
	    source_embeddings.push_back(concatenate(std::vector<Expression>({src_fwd[i], src_bwd[i]})));
    }
    src = concatenate_cols(source_embeddings); 

    // now for the target sentence
    i_R = parameter(cg, p_R); // hidden -> word rep parameter
    i_Q = parameter(cg, p_Q);
    i_P = parameter(cg, p_P);
    i_bias = parameter(cg, p_bias);  // word bias
    i_Wa = parameter(cg, p_Wa); 
    i_Ua = parameter(cg, p_Ua);
    i_va = parameter(cg, p_va);
    i_uax = i_Ua * src; 

    // reset aux_vecs counter, allowing the memory to be reused
    num_aux_vecs = 0;

    if (giza_fertility || giza_markov || giza_positional) {
	i_Ta = parameter(cg, p_Ta);   
        if (giza_positional) {
            i_src_idx = arange(cg, 0, slen, true, auxiliary_vector());
            i_src_len = repeat(cg, slen, log(1.0 + slen), auxiliary_vector());
        }
    }

    aligns.clear();
    aligns.push_back(repeat(cg, slen, 0.0f, auxiliary_vector()));

    // initialilse h from global information of the source sentence
#ifndef RNN_H0_IS_ZERO
    std::vector<Expression> h0;
    Expression i_src = average(source_embeddings); // try max instead?
    int hidden_layers = builder.num_h0_components();
    for (int l = 0; l < hidden_layers; ++l) {
	Expression i_Wh0 = parameter(cg, p_Wh0[l]);
	h0.push_back(tanh(i_Wh0 * i_src));
    }
    builder.new_graph(cg); 
    builder.start_new_sequence(h0);
#else
    builder.new_graph(cg); 
    builder.start_new_sequence();
#endif

    // document context; n.b. use "0" context for the first sentence
    if (doc_context && ctx != 0) { 
        const std::vector<int> &context = *ctx;

        std::vector<Expression> ctx_embed;
        if (!rnn_src_embeddings) {
            for (unsigned s = 1; s+1 < context.size(); ++s) 
                ctx_embed.push_back(lookup(cg, p_cs, context[s]));
        } else {
            ctx_embed.resize(context.size()-1);
            builder_src_fwd.start_new_sequence();
            for (unsigned i = 0; i+1 < context.size(); ++i) 
                ctx_embed[i] = builder_src_fwd.add_input(lookup(cg, p_cs, context[i]));
        }
        Expression avg_context = average(source_embeddings); 
        i_S = parameter(cg, p_S);
        i_tt_ctx = i_S * avg_context;
        has_document_context = true;
    } else {
        has_document_context = false;
    }
}